

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O3

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeFaceAreas
          (IntrinsicGeometryInterface *this)

{
  bool bVar1;
  SurfaceMesh *pSVar2;
  size_t sVar3;
  pointer puVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  pointer puVar8;
  double dVar9;
  long lVar10;
  runtime_error *this_00;
  long *plVar11;
  size_type *psVar12;
  long *plVar13;
  ParentMeshT *pPVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  unsigned_long uVar18;
  unsigned_long uVar19;
  pointer puVar20;
  undefined1 auVar21 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  undefined1 local_c8 [24];
  long lStack_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->edgeLengthsQ).super_DependentQuantity.computed == false) {
    if ((this->edgeLengthsQ).super_DependentQuantity.evaluateFunc.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*(this->edgeLengthsQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->edgeLengthsQ).super_DependentQuantity.evaluateFunc);
    (this->edgeLengthsQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Face,_double>::MeshData
            ((MeshData<geometrycentral::surface::Face,_double> *)local_c8,
             (this->super_BaseGeometryInterface).mesh);
  MeshData<geometrycentral::surface::Face,_double>::operator=
            (&this->faceAreas,(MeshData<geometrycentral::surface::Face,_double> *)local_c8);
  MeshData<geometrycentral::surface::Face,_double>::~MeshData
            ((MeshData<geometrycentral::surface::Face,_double> *)local_c8);
  pSVar2 = (this->super_BaseGeometryInterface).mesh;
  sVar3 = pSVar2->nFacesFillCount;
  if ((sVar3 == 0) ||
     (puVar4 = (pSVar2->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar4 != 0xffffffffffffffff)) {
    sVar15 = 0;
  }
  else {
    sVar15 = 0;
    do {
      if (sVar3 - 1 == sVar15) {
        return;
      }
      lVar10 = sVar15 + 1;
      sVar15 = sVar15 + 1;
    } while (puVar4[lVar10] == 0xffffffffffffffff);
  }
  if (sVar15 != sVar3) {
    puVar4 = (pSVar2->fHalfedgeArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar1 = pSVar2->useImplicitTwinFlag;
    pdVar5 = (this->edgeLengths).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             .m_storage.m_data;
    pdVar6 = (this->faceAreas).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    do {
      uVar7 = puVar4[sVar15];
      if (bVar1 == false) {
        puVar20 = (pSVar2->heNextArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar8 = (pSVar2->heEdgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar16 = puVar8[uVar7];
        uVar19 = puVar8[puVar20[uVar7]];
        uVar17 = puVar20[puVar20[uVar7]];
        uVar18 = puVar8[uVar17];
      }
      else {
        puVar20 = (pSVar2->heNextArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar16 = uVar7 >> 1;
        uVar17 = puVar20[puVar20[uVar7]];
        uVar19 = puVar20[uVar7] >> 1;
        uVar18 = uVar17 >> 1;
      }
      if (puVar20[uVar17] != uVar7) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,
                   "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]gc-polyscope-project-template/deps/geometry-central/src/surface/intrinsic_geometry_interface.cpp"
                   ,"");
        ::std::operator+(&local_70,"GC_SAFETY_ASSERT FAILURE from ",&local_108);
        plVar11 = (long *)::std::__cxx11::string::append((char *)&local_70);
        psVar12 = (size_type *)(plVar11 + 2);
        local_128._M_dataplus._M_p = (pointer)*plVar11;
        if ((size_type *)local_128._M_dataplus._M_p == psVar12) {
          local_128.field_2._M_allocated_capacity = *psVar12;
          local_128.field_2._8_8_ = plVar11[3];
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar12;
        }
        local_128._M_string_length = plVar11[1];
        *plVar11 = (long)psVar12;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        ::std::__cxx11::to_string(&local_90,0x4a);
        ::std::operator+(&local_50,&local_128,&local_90);
        plVar11 = (long *)::std::__cxx11::string::append((char *)&local_50);
        plVar13 = plVar11 + 2;
        local_e8 = (long *)*plVar11;
        if (local_e8 == plVar13) {
          local_d8 = *plVar13;
          lStack_d0 = plVar11[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *plVar13;
        }
        local_e0 = plVar11[1];
        *plVar11 = (long)plVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)::std::__cxx11::string::append((char *)&local_e8);
        pPVar14 = (ParentMeshT *)(plVar11 + 2);
        local_c8._0_8_ = *plVar11;
        if ((ParentMeshT *)local_c8._0_8_ == pPVar14) {
          local_c8._16_8_ = pPVar14->_vptr_SurfaceMesh;
          lStack_b0 = plVar11[3];
          local_c8._0_8_ = (ParentMeshT *)(local_c8 + 0x10);
        }
        else {
          local_c8._16_8_ = pPVar14->_vptr_SurfaceMesh;
        }
        local_c8._8_8_ = plVar11[1];
        *plVar11 = (long)pPVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        ::std::runtime_error::runtime_error(this_00,(string *)local_c8);
        __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      dVar9 = (pdVar5[uVar18] + pdVar5[uVar16] + pdVar5[uVar19]) * 0.5;
      auVar21._8_8_ = 0;
      auVar21._0_8_ =
           (dVar9 - pdVar5[uVar18]) * (dVar9 - pdVar5[uVar19]) * dVar9 * (dVar9 - pdVar5[uVar16]);
      auVar21 = vmaxsd_avx(auVar21,ZEXT816(0) << 0x40);
      auVar21 = vsqrtsd_avx(auVar21,auVar21);
      pdVar6[sVar15] = auVar21._0_8_;
      do {
        if (sVar3 - 1 == sVar15) {
          return;
        }
        lVar10 = sVar15 + 1;
        sVar15 = sVar15 + 1;
      } while (puVar4[lVar10] == 0xffffffffffffffff);
    } while (sVar3 != sVar15);
  }
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeFaceAreas() {
  edgeLengthsQ.ensureHave();

  // ONEDAY try these for better accuracy in near-degenerate triangles?
  // "Miscalculating Area and Angles of a Needle-like Triangle" https://www.cs.unc.edu/~snoeyink/c/c205/Triangle.pdf

  faceAreas = FaceData<double>(mesh);
  for (Face f : mesh.faces()) {
    // WARNING: Logic duplicated between cached and immediate version

    Halfedge he = f.halfedge();
    double a = edgeLengths[he.edge()];
    he = he.next();
    double b = edgeLengths[he.edge()];
    he = he.next();
    double c = edgeLengths[he.edge()];

    GC_SAFETY_ASSERT(he.next() == f.halfedge(), "faces must be triangular");

    // Herons formula
    double s = (a + b + c) / 2.0;
    double arg = s * (s - a) * (s - b) * (s - c);
    arg = std::fmax(0., arg);
    double area = std::sqrt(arg);

    faceAreas[f] = area;
  }
}